

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dealDoubleEdge(void)

{
  int iVar1;
  pointer ppVar2;
  long lVar3;
  int __tmp;
  size_t i_1;
  ulong uVar4;
  ulong __new_size;
  size_t i;
  long lVar5;
  
  fprintf(_stderr,"number of edges before dealDoubleEdge: %lu\n",
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar2 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar3 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    iVar1 = ppVar2[lVar5].first;
    if (ppVar2[lVar5].second < iVar1) {
      ppVar2[lVar5].first = ppVar2[lVar5].second;
      ppVar2[lVar5].second = iVar1;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ();
  ppVar2 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = 1;
  __new_size = uVar4;
  for (; uVar4 < (ulong)(lVar3 >> 3); uVar4 = uVar4 + 1) {
    iVar1 = ppVar2[uVar4].second;
    if ((ppVar2[uVar4].first != ppVar2[uVar4 - 1].first) || (iVar1 != ppVar2[uVar4 - 1].second)) {
      ppVar2[__new_size].first = ppVar2[uVar4].first;
      ppVar2[__new_size].second = iVar1;
      __new_size = __new_size + 1;
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize(&edges,__new_size)
  ;
  fprintf(_stderr,"number of edges after dealDoubleEdge: %lu\n",
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

void dealDoubleEdge() {
	fprintf(stderr, "number of edges before dealDoubleEdge: %lu\n", edges.size());
	// 排序
	for (size_t i = 0; i < edges.size(); i++) {
		if (edges[i].first > edges[i].second) swap(edges[i].first, edges[i].second);
	}
	sort(edges.begin(), edges.end());
	// 去重
	size_t cur = 1;
	for (size_t last = 0, i = 1; i < edges.size(); ++i, last = i-1) {
		if (edges[i] != edges[last]) {
			edges[cur++] = edges[i];
		}
	}
	edges.resize(cur);
	fprintf(stderr, "number of edges after dealDoubleEdge: %lu\n", edges.size());
}